

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

bool Imath_2_5::anon_unknown_18::twoSidedJacobiRotation<float>
               (Matrix44<float> *A,int j,int k,Matrix44<float> *U,Matrix44<float> *V,float tol)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  float *pfVar5;
  int in_EDX;
  int in_ESI;
  int __x;
  Matrix44<float> *in_RDI;
  Matrix44<float> *pMVar6;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float fVar7;
  float fVar8;
  float s_00;
  float fVar9;
  double dVar10;
  float tau2_1;
  float tau1_1;
  int l_1;
  float tau2;
  float tau1;
  int l;
  float d_2;
  float d_1;
  float s_1;
  float c_1;
  float t_2;
  float rho_2;
  float s_2;
  float c_2;
  float rho;
  float r;
  float p;
  float s;
  float c;
  float mu_2;
  float mu_1;
  bool changed;
  float z;
  float y;
  float x;
  float w;
  float in_stack_ffffffffffffff58;
  float j_00;
  float fVar11;
  int local_8c;
  int local_80;
  float local_6c;
  float local_64;
  float local_60;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  bool local_1;
  
  pfVar5 = Matrix44<float>::operator[](in_RDI,in_ESI);
  fVar9 = pfVar5[in_ESI];
  pfVar5 = Matrix44<float>::operator[](in_RDI,in_ESI);
  fVar1 = pfVar5[in_EDX];
  pfVar5 = Matrix44<float>::operator[](in_RDI,in_EDX);
  fVar2 = pfVar5[in_ESI];
  pMVar6 = in_RDI;
  pfVar5 = Matrix44<float>::operator[](in_RDI,in_EDX);
  fVar3 = pfVar5[in_EDX];
  bVar4 = false;
  __x = (int)pMVar6;
  std::abs(__x);
  fVar11 = extraout_XMM0_Da;
  std::abs(__x);
  if (in_XMM0_Da * extraout_XMM0_Da_00 < fVar11) {
    local_4c = (fVar9 + fVar3) / (fVar1 - fVar2);
    dVar10 = std::sqrt((double)(ulong)(uint)(local_4c * local_4c + 1.0));
    local_50 = 1.0 / SUB84(dVar10,0);
    if (local_4c < 0.0) {
      local_50 = -local_50;
    }
    local_4c = local_50 * local_4c;
    local_44 = local_50 * (fVar1 + fVar2) + local_4c * (fVar3 - fVar9);
    local_48 = (local_4c * fVar1 + -(local_50 * fVar3)) * 2.0;
    bVar4 = true;
  }
  else {
    local_4c = 1.0;
    local_50 = 0.0;
    local_44 = fVar3 - fVar9;
    local_48 = fVar1 + fVar2;
  }
  std::abs(__x);
  j_00 = extraout_XMM0_Da_01;
  std::abs(__x);
  if (in_XMM0_Da * extraout_XMM0_Da_02 < j_00) {
    local_44 = local_44 / local_48;
    std::abs(__x);
    in_stack_ffffffffffffff58 = extraout_XMM0_Da_03;
    dVar10 = std::sqrt((double)(ulong)(uint)(local_44 * local_44 + 1.0));
    local_6c = 1.0 / (in_stack_ffffffffffffff58 + SUB84(dVar10,0));
    if (local_44 < 0.0) {
      local_6c = -local_6c;
    }
    dVar10 = std::sqrt((double)(ulong)(uint)(local_6c * local_6c + 1.0));
    local_60 = 1.0 / SUB84(dVar10,0);
    local_64 = local_60 * local_6c;
    bVar4 = true;
  }
  else {
    local_60 = 1.0;
    local_64 = 0.0;
  }
  fVar7 = local_60 * local_4c + -(local_64 * local_50);
  fVar8 = local_64 * local_4c + local_60 * local_50;
  if (bVar4) {
    s_00 = fVar7 * (fVar9 * local_60 + -(fVar1 * local_64)) +
           -(fVar8 * (fVar2 * local_60 + -(fVar3 * local_64)));
    fVar9 = fVar8 * (fVar9 * local_64 + fVar1 * local_60) +
            fVar7 * (fVar2 * local_64 + fVar3 * local_60);
    pfVar5 = Matrix44<float>::operator[](in_RDI,in_ESI);
    pfVar5[in_ESI] = s_00;
    pfVar5 = Matrix44<float>::operator[](in_RDI,in_EDX);
    pfVar5[in_EDX] = fVar9;
    pfVar5 = Matrix44<float>::operator[](in_RDI,in_EDX);
    pfVar5[in_ESI] = 0.0;
    pfVar5 = Matrix44<float>::operator[](in_RDI,in_ESI);
    pfVar5[in_EDX] = 0.0;
    for (local_80 = 0; local_80 < 4; local_80 = local_80 + 1) {
      if ((local_80 != in_ESI) && (local_80 != in_EDX)) {
        pfVar5 = Matrix44<float>::operator[](in_RDI,in_ESI);
        fVar1 = pfVar5[local_80];
        pfVar5 = Matrix44<float>::operator[](in_RDI,in_EDX);
        fVar2 = pfVar5[local_80];
        pfVar5 = Matrix44<float>::operator[](in_RDI,in_ESI);
        pfVar5[local_80] = fVar7 * fVar1 + -(fVar8 * fVar2);
        pfVar5 = Matrix44<float>::operator[](in_RDI,in_EDX);
        pfVar5[local_80] = fVar8 * fVar1 + fVar7 * fVar2;
      }
    }
    for (local_8c = 0; local_8c < 4; local_8c = local_8c + 1) {
      if ((local_8c != in_ESI) && (local_8c != in_EDX)) {
        pfVar5 = Matrix44<float>::operator[](in_RDI,local_8c);
        fVar1 = pfVar5[in_ESI];
        pfVar5 = Matrix44<float>::operator[](in_RDI,local_8c);
        fVar2 = pfVar5[in_EDX];
        pfVar5 = Matrix44<float>::operator[](in_RDI,local_8c);
        pfVar5[in_ESI] = local_60 * fVar1 + -(local_64 * fVar2);
        pfVar5 = Matrix44<float>::operator[](in_RDI,local_8c);
        pfVar5[in_EDX] = local_64 * fVar1 + local_60 * fVar2;
      }
    }
    jacobiRotateRight<float>
              ((Matrix44<float> *)CONCAT44(fVar11,in_XMM0_Da),(int)j_00,
               (int)in_stack_ffffffffffffff58,fVar9,s_00);
    jacobiRotateRight<float>
              ((Matrix44<float> *)CONCAT44(fVar11,in_XMM0_Da),(int)j_00,
               (int)in_stack_ffffffffffffff58,fVar9,s_00);
    local_1 = true;
  }
  else {
    pfVar5 = Matrix44<float>::operator[](in_RDI,in_EDX);
    pfVar5[in_ESI] = 0.0;
    pfVar5 = Matrix44<float>::operator[](in_RDI,in_ESI);
    pfVar5[in_EDX] = 0.0;
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
twoSidedJacobiRotation (IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A,
                        int j,
                        int k,
                        IMATH_INTERNAL_NAMESPACE::Matrix44<T>& U,
                        IMATH_INTERNAL_NAMESPACE::Matrix44<T>& V,
                        const T tol)
{
    // Load everything into local variables to make things easier on the
    // optimizer:
    const T w = A[j][j];
    const T x = A[j][k];
    const T y = A[k][j];
    const T z = A[k][k];

    // We will keep track of whether we're actually performing any rotations,
    // since if the matrix is already diagonal we'll end up with the identity
    // as our Jacobi rotation and we can short-circuit.
    bool changed = false;

    // The first step is to symmetrize the 2x2 matrix,
    //   [ c  s ]^T [ w x ] = [ p q ]
    //   [ -s c ]   [ y z ]   [ q r ]
    T mu_1 = w + z;
    T mu_2 = x - y;

    T c, s;
    if (std::abs(mu_2) <= tol*std::abs(mu_1))  // Already symmetric (to tolerance)
    {                                          // Note that the <= is important here
        c = T(1);                              // because we want to bypass the computation
        s = T(0);                              // of rho if mu_1 = mu_2 = 0.

        const T p = w;
        const T r = z;
        mu_1 = r - p;
        mu_2 = x + y;
    }
    else
    {
        const T rho = mu_1 / mu_2;
        s = T(1) / std::sqrt (T(1) + rho*rho);  // TODO is there a native inverse square root function?
        if (rho < 0)
            s = -s;
        c = s * rho;

        mu_1 = s * (x + y) + c * (z - w);   // = r - p
        mu_2 = T(2) * (c * x - s * z);      // = 2*q

        changed = true;
    }

    // The second stage diagonalizes,
    //   [ c2   s2 ]^T [ p q ] [ c2  s2 ]  = [ d1   0 ]
    //   [ -s2  c2 ]   [ q r ] [ -s2 c2 ]    [  0  d2 ]
    T c_2, s_2;
    if (std::abs(mu_2) <= tol*std::abs(mu_1))
    {
       c_2 = T(1);
       s_2 = T(0);
    }
    else
    {
        const T rho_2 = mu_1 / mu_2;
        T t_2 = T(1) / (std::abs(rho_2) + std::sqrt(1 + rho_2*rho_2));
        if (rho_2 < 0)
            t_2 = -t_2;
        c_2 = T(1) / std::sqrt (T(1) + t_2*t_2);
        s_2 = c_2 * t_2;

        changed = true;
    }

    const T c_1 = c_2 * c - s_2 * s;
    const T s_1 = s_2 * c + c_2 * s;

    if (!changed)
    {
        // We've decided that the off-diagonal entries are already small
        // enough, so we'll set them to zero.  This actually appears to result
        // in smaller errors than leaving them be, possibly because it prevents
        // us from trying to do extra rotations later that we don't need.
        A[k][j] = 0;
        A[j][k] = 0;
        return false;
    }

    const T d_1 = c_1*(w*c_2 - x*s_2) - s_1*(y*c_2 - z*s_2);
    const T d_2 = s_1*(w*s_2 + x*c_2) + c_1*(y*s_2 + z*c_2);

    // For the entries we just zeroed out, we'll just set them to 0, since
    // they should be 0 up to machine precision.  
    A[j][j] = d_1;
    A[k][k] = d_2;
    A[k][j] = 0;
    A[j][k] = 0;

    // Rotate the entries that _weren't_ involved in the 2x2 SVD:
    for (int l = 0; l < 4; ++l)
    {
        if (l == j || l == k)
            continue;

        // Rotate on the left by
        //    [ 1               ]
        //    [   .             ]
        //    [     c2   s2     ]  j
        //    [        1        ]
        //    [    -s2   c2     ]  k
        //    [             .   ]
        //    [               1 ]
        //          j    k
        //
        // This has the effect of adding the (weighted) ith and jth _rows_ to
        // each other.  
        const T tau1 = A[j][l];
        const T tau2 = A[k][l];
        A[j][l] = c_1 * tau1 - s_1 * tau2;
        A[k][l] = s_1 * tau1 + c_1 * tau2;
    }

    for (int l = 0; l < 4; ++l)
    {
        // We set the A[j/k][j/k] entries already
        if (l == j || l == k)
            continue;

        // Rotate on the right by
        //    [ 1               ]
        //    [   .             ]
        //    [     c2   s2     ]  j
        //    [        1        ]
        //    [    -s2   c2     ]  k
        //    [             .   ]
        //    [               1 ]
        //          j    k
        //
        // This has the effect of adding the (weighted) ith and jth _columns_ to
        // each other.  
        const T tau1 = A[l][j];
        const T tau2 = A[l][k];
        A[l][j] = c_2 * tau1 - s_2 * tau2;
        A[l][k] = s_2 * tau1 + c_2 * tau2;
    }

    // Now apply the rotations to U and V:
    // Remember that we have 
    //    R1^T * A * R2 = D
    // This is in the 2x2 case, but after doing a bunch of these
    // we will get something like this for the 3x3 case:
    //   ... R1b^T * R1a^T * A * R2a * R2b * ... = D
    //   -----------------       ---------------
    //        = U^T                    = V
    // So,
    //   U = R1a * R1b * ...
    //   V = R2a * R2b * ...
    jacobiRotateRight (U, j, k, c_1, s_1);
    jacobiRotateRight (V, j, k, c_2, s_2);

    return true;
}